

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

string * __thiscall helics::CommonCore::getAddress_abi_cxx11_(CommonCore *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (((this->super_BrokerBase).brokerState._M_i != CONNECTED) ||
     ((this->super_BrokerBase).address._M_string_length == 0)) {
    (*(this->super_BrokerBase)._vptr_BrokerBase[7])(&local_30,&this->super_BrokerBase);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(this->super_BrokerBase).address,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return (string *)&(this->super_BrokerBase).address;
}

Assistant:

const std::string& CommonCore::getAddress() const
{
    if ((getBrokerState() != BrokerState::CONNECTED) || (address.empty())) {
        address = generateLocalAddressString();
    }
    return address;
}